

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O2

int CVodeGetLinWorkSpace(void *cvode_mem,long *lenrwLS,long *leniwLS)

{
  SUNMatrix p_Var1;
  int iVar2;
  int iVar3;
  long liw;
  long lrw;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  sunindextype liw1;
  sunindextype lrw1;
  long local_58;
  long local_50;
  CVLsMem local_48;
  CVodeMem local_40;
  long local_38;
  long local_30;
  
  iVar2 = cvLs_AccessLMem(cvode_mem,"CVodeGetLinWorkSpace",&local_40,&local_48);
  if (iVar2 == 0) {
    *lenrwLS = 2;
    *leniwLS = 0x1e;
    if (local_40->cv_tempv->ops->nvspace !=
        (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
      N_VSpace(local_40->cv_tempv,&local_30,&local_38);
      *lenrwLS = *lenrwLS + local_30 * 2;
      *leniwLS = *leniwLS + local_38 * 2;
    }
    p_Var1 = local_48->savedJ;
    if ((p_Var1 != (SUNMatrix)0x0) &&
       (p_Var1->ops->space != (_func_SUNErrCode_SUNMatrix_long_ptr_long_ptr *)0x0)) {
      iVar3 = SUNMatSpace(p_Var1,&local_50,&local_58);
      if (iVar3 == 0) {
        *lenrwLS = *lenrwLS + local_50;
        *leniwLS = *leniwLS + local_58;
      }
    }
    if (local_48->LS->ops->space != (_func_SUNErrCode_SUNLinearSolver_long_ptr_long_ptr *)0x0) {
      iVar3 = SUNLinSolSpace(local_48->LS,&local_50,&local_58);
      if (iVar3 == 0) {
        *lenrwLS = *lenrwLS + local_50;
        *leniwLS = *leniwLS + local_58;
      }
    }
  }
  return iVar2;
}

Assistant:

int CVodeGetLinWorkSpace(void* cvode_mem, long int* lenrwLS, long int* leniwLS)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  sunindextype lrw1, liw1;
  long int lrw, liw;
  int retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* start with fixed sizes plus vector/matrix pointers */
  *lenrwLS = 2;
  *leniwLS = 30;

  /* add NVector sizes */
  if (cv_mem->cv_tempv->ops->nvspace)
  {
    N_VSpace(cv_mem->cv_tempv, &lrw1, &liw1);
    *lenrwLS += 2 * lrw1;
    *leniwLS += 2 * liw1;
  }

  /* add SUNMatrix size (only account for the one owned by Ls interface) */
  if (cvls_mem->savedJ)
  {
    if (cvls_mem->savedJ->ops->space)
    {
      retval = SUNMatSpace(cvls_mem->savedJ, &lrw, &liw);
      if (retval == 0)
      {
        *lenrwLS += lrw;
        *leniwLS += liw;
      }
    }
  }

  /* add LS sizes */
  if (cvls_mem->LS->ops->space)
  {
    retval = SUNLinSolSpace(cvls_mem->LS, &lrw, &liw);
    if (retval == 0)
    {
      *lenrwLS += lrw;
      *leniwLS += liw;
    }
  }

  return (CVLS_SUCCESS);
}